

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

uint prvTidyHTMLVersionNumberFromCode(uint vers)

{
  long lVar1;
  
  lVar1 = 8;
  do {
    if (*(uint *)((long)&PTR_prvTidyParsePre_001c7ad8 + lVar1 + 4) == vers) {
      return *(uint *)((long)&W3C_Doctypes[0].score + lVar1);
    }
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0x300);
  return 0;
}

Assistant:

uint TY_(HTMLVersionNumberFromCode)( uint vers )
{
    uint i;

    for (i = 0; W3C_Doctypes[i].name; ++i)
        if (W3C_Doctypes[i].vers == vers)
            return W3C_Doctypes[i].vers_out;

    return VERS_UNKNOWN;
}